

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>
                   (string *__return_storage_ptr__,static_string_view *a,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   static_string_view *args,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   static_string_view *args_2,
                   basic_string_view<char,_std::char_traits<char>_> *args_3)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view view;
  cmAlphaNum local_258;
  size_t local_220;
  char *local_218;
  cmAlphaNum local_210;
  cmAlphaNum local_1d8;
  undefined8 local_1a0;
  size_type local_198;
  cmAlphaNum local_190;
  cmAlphaNum local_158;
  size_t local_120;
  char *local_118;
  cmAlphaNum local_110;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_d8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_c0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_90;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  pStack_60;
  iterator local_48;
  undefined8 local_40;
  string_view *local_38;
  static_string_view *args_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  static_string_view *args_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b_local;
  static_string_view *a_local;
  
  local_120 = (a->super_string_view)._M_len;
  local_118 = (a->super_string_view)._M_str;
  local_38 = &args_2->super_string_view;
  args_local_2 = (static_string_view *)args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (static_string_view *)b;
  b_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a;
  a_local = (static_string_view *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_110,a->super_string_view);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&local_d8,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_110);
  cmAlphaNum::cmAlphaNum(&local_158,(string *)args_local);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_c0,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_158);
  local_1a0 = *(undefined8 *)args_local_1;
  local_198 = args_local_1->_M_string_length;
  cmAlphaNum::cmAlphaNum(&local_190,*(string_view *)args_local_1);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_a8,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_190);
  cmAlphaNum::cmAlphaNum(&local_1d8,(string *)args_local_2);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_90,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_1d8);
  local_220 = local_38->_M_len;
  local_218 = local_38->_M_str;
  cmAlphaNum::cmAlphaNum(&local_210,*local_38);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_78,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_210);
  view._M_len = args_3->_M_len;
  view._M_str = args_3->_M_str;
  cmAlphaNum::cmAlphaNum(&local_258,view);
  cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
  ::{lambda(cmAlphaNum_const&)#1}::operator()[abi_cxx11_
            (&pStack_60,
             &cmStrCat<cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::__cxx11::string_const&,cm::static_string_view,std::basic_string_view<char,std::char_traits<char>>>(cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::__cxx11::string_const&,cm::static_string_view&&,std::basic_string_view<char,std::char_traits<char>>&&)
              ::makePair,&local_258);
  local_48 = &local_d8;
  local_40 = 6;
  views._M_len = 6;
  views._M_array = local_48;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}